

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixWritableFile::Append(PosixWritableFile *this,Slice *data)

{
  size_t __n;
  bool bVar1;
  char *__src;
  unsigned_long *puVar2;
  Slice *in_RDX;
  undefined1 local_48 [8];
  Status status;
  size_t copy_size;
  char *write_data;
  size_t write_size;
  Slice *data_local;
  PosixWritableFile *this_local;
  
  write_size = (size_t)in_RDX;
  data_local = data;
  this_local = this;
  write_data = (char *)Slice::size(in_RDX);
  __src = Slice::data((Slice *)write_size);
  status.state_ = (char *)(0x10000 - data[0x1000].size_);
  puVar2 = std::min<unsigned_long>((unsigned_long *)&write_data,(unsigned_long *)&status);
  __n = *puVar2;
  memcpy((void *)((long)&data->size_ + data[0x1000].size_),__src,__n);
  write_data = write_data + -__n;
  data[0x1000].size_ = __n + data[0x1000].size_;
  if (write_data == (char *)0x0) {
    Status::OK();
  }
  else {
    FlushBuffer((PosixWritableFile *)local_48);
    bVar1 = Status::ok((Status *)local_48);
    if (bVar1) {
      if (write_data < (char *)0x10000) {
        memcpy(&data->size_,__src + __n,(size_t)write_data);
        data[0x1000].size_ = (size_t)write_data;
        Status::OK();
      }
      else {
        WriteUnbuffered(this,(char *)data,(size_t)(__src + __n));
      }
    }
    else {
      Status::Status((Status *)this,(Status *)local_48);
    }
    Status::~Status((Status *)local_48);
  }
  return (Status)(char *)this;
}

Assistant:

Status Append(const Slice& data) override {
    size_t write_size = data.size();
    const char* write_data = data.data();

    // Fit as much as possible into buffer.
    size_t copy_size = std::min(write_size, kWritableFileBufferSize - pos_);
    std::memcpy(buf_ + pos_, write_data, copy_size);
    write_data += copy_size;
    write_size -= copy_size;
    pos_ += copy_size;
    if (write_size == 0) {
      return Status::OK();
    }

    // Can't fit in buffer, so need to do at least one write.
    Status status = FlushBuffer();
    if (!status.ok()) {
      return status;
    }

    // Small writes go to buffer, large writes are written directly.
    if (write_size < kWritableFileBufferSize) {
      std::memcpy(buf_, write_data, write_size);
      pos_ = write_size;
      return Status::OK();
    }
    return WriteUnbuffered(write_data, write_size);
  }